

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O1

void ini_property_add(ini_t *ini,int section,char *name,int name_length,char *value,int value_length
                     )

{
  int iVar1;
  ini_internal_property_t *piVar2;
  char *pcVar3;
  size_t sVar4;
  
  if ((((-1 < section) && (ini != (ini_t *)0x0)) && (name != (char *)0x0)) &&
     (section < ini->section_count)) {
    if (name_length < 1) {
      name_length = sx_strlen(name);
    }
    if (value_length < 1) {
      value_length = sx_strlen(value);
    }
    iVar1 = ini->property_capacity;
    if (iVar1 <= ini->property_count) {
      ini->property_capacity = iVar1 * 2;
      piVar2 = (ini_internal_property_t *)
               (**ini->memctx)(0,(long)iVar1 * 0xf0,0,0,0,0,*(undefined8 *)((long)ini->memctx + 8));
      memcpy(piVar2,ini->properties,(long)ini->property_count * 0x78);
      (**ini->memctx)(ini->properties,0,0,0,0,0,*(undefined8 *)((long)ini->memctx + 8));
      ini->properties = piVar2;
    }
    piVar2 = ini->properties;
    iVar1 = ini->property_count;
    piVar2[iVar1].section = section;
    piVar2[iVar1].name_large = (char *)0x0;
    piVar2[iVar1].value_large = (char *)0x0;
    if (name_length - 0x1fU < 0xffffffe0) {
      sVar4 = (size_t)name_length;
      pcVar3 = (char *)(**ini->memctx)(0,sVar4 + 1,0,0,0,0,*(undefined8 *)((long)ini->memctx + 8));
      ini->properties[ini->property_count].name_large = pcVar3;
      memcpy(pcVar3,name,sVar4);
      pcVar3 = ini->properties[ini->property_count].name_large + sVar4;
    }
    else {
      memcpy(piVar2[iVar1].name,name,(long)name_length);
      pcVar3 = ini->properties[ini->property_count].name + name_length;
    }
    *pcVar3 = '\0';
    if (value_length - 0x3fU < 0xffffffc0) {
      sVar4 = (size_t)value_length;
      pcVar3 = (char *)(**ini->memctx)(0,sVar4 + 1,0,0,0,0,*(undefined8 *)((long)ini->memctx + 8));
      ini->properties[ini->property_count].value_large = pcVar3;
      memcpy(pcVar3,value,sVar4);
      pcVar3 = ini->properties[ini->property_count].value_large + sVar4;
    }
    else {
      memcpy(ini->properties[ini->property_count].value,value,(long)value_length);
      pcVar3 = ini->properties[ini->property_count].value + value_length;
    }
    *pcVar3 = '\0';
    ini->property_count = ini->property_count + 1;
  }
  return;
}

Assistant:

void ini_property_add( ini_t* ini, int section, char const* name, int name_length, char const* value, int value_length )
    {
    struct ini_internal_property_t* new_properties;

    if( ini && name && section >= 0 && section < ini->section_count )
        {
        if( name_length <= 0 ) name_length = (int) INI_STRLEN( name );
        if( value_length <= 0 ) value_length = (int) INI_STRLEN( value );

        if( ini->property_count >= ini->property_capacity )
            {

            ini->property_capacity *= 2;
            new_properties = (struct ini_internal_property_t*) INI_MALLOC( ini->memctx, 
                ini->property_capacity * sizeof( ini->properties[ 0 ] ) );
            INI_MEMCPY( new_properties, ini->properties, ini->property_count * sizeof( ini->properties[ 0 ] ) );
            INI_FREE( ini->memctx, ini->properties );
            ini->properties = new_properties;
            }
        
        ini->properties[ ini->property_count ].section = section;
        ini->properties[ ini->property_count ].name_large = 0;
        ini->properties[ ini->property_count ].value_large = 0;

        if( name_length + 1 >= sizeof( ini->properties[ 0 ].name ) )
            {
            ini->properties[ ini->property_count ].name_large = (char*) INI_MALLOC( ini->memctx, (size_t) name_length + 1 );
            INI_MEMCPY( ini->properties[ ini->property_count ].name_large, name, (size_t) name_length );
            ini->properties[ ini->property_count ].name_large[ name_length ] = '\0';
            }
        else
            {
            INI_MEMCPY( ini->properties[ ini->property_count ].name, name, (size_t) name_length );
            ini->properties[ ini->property_count ].name[ name_length ] = '\0';
            }

        if( value_length + 1 >= sizeof( ini->properties[ 0 ].value ) )
            {
            ini->properties[ ini->property_count ].value_large = (char*) INI_MALLOC( ini->memctx, (size_t) value_length + 1 );
            INI_MEMCPY( ini->properties[ ini->property_count ].value_large, value, (size_t) value_length );
            ini->properties[ ini->property_count ].value_large[ value_length ] = '\0';
            }
        else
            {
            INI_MEMCPY( ini->properties[ ini->property_count ].value, value, (size_t) value_length );
            ini->properties[ ini->property_count ].value[ value_length ] = '\0';
            }

        ++ini->property_count;
        }
    }